

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::setValue<el::base::SubsecondPrecision>
          (TypedConfigurations *this,Level level,SubsecondPrecision *value,
          map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
          *confMap,bool includeGlobalLevel)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint uVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  Level local_1c;
  pair<el::Level,_el::base::SubsecondPrecision> local_18;
  
  local_1c = level;
  if ((confMap->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0 && includeGlobalLevel) {
    local_18.second.m_width = (*value).m_width;
    local_18.second.m_offset = (*value).m_offset;
    local_18.first = Global;
  }
  else {
    p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = (confMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = p_Var2;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar8]) {
      bVar8 = p_Var5[1]._M_color == _S_red;
      if (!bVar8) {
        p_Var6 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, _S_black < p_Var6[1]._M_color)) {
      p_Var6 = &p_Var1->_M_header;
      p_Var5 = &p_Var1->_M_header;
    }
    p_Var7 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (iVar10 = -(uint)((*value).m_width == (int)*(undefined8 *)&p_Var5[1].field_0x4),
       iVar11 = -(uint)((*value).m_offset ==
                       (uint)((ulong)*(undefined8 *)&p_Var5[1].field_0x4 >> 0x20)),
       auVar9._4_4_ = iVar10, auVar9._0_4_ = iVar10, auVar9._8_4_ = iVar11, auVar9._12_4_ = iVar11,
       iVar10 = movmskpd((int)p_Var6,auVar9), iVar10 == 3)) {
      return;
    }
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar8]) {
      bVar8 = p_Var2[1]._M_color < level;
      if (!bVar8) {
        p_Var7 = p_Var2;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var5 = p_Var7, level < p_Var7[1]._M_color)) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      pmVar4 = utils::std::
               map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
               ::at(confMap,&local_1c);
      uVar3 = value->m_offset;
      pmVar4->m_width = value->m_width;
      pmVar4->m_offset = uVar3;
      return;
    }
    local_18.second.m_width = (*value).m_width;
    local_18.second.m_offset = (*value).m_offset;
    local_18.first = level;
  }
  std::
  _Rb_tree<el::Level,std::pair<el::Level_const,el::base::SubsecondPrecision>,std::_Select1st<std::pair<el::Level_const,el::base::SubsecondPrecision>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
  ::_M_emplace_unique<std::pair<el::Level,el::base::SubsecondPrecision>>
            ((_Rb_tree<el::Level,std::pair<el::Level_const,el::base::SubsecondPrecision>,std::_Select1st<std::pair<el::Level_const,el::base::SubsecondPrecision>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
              *)confMap,&local_18);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }